

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O0

string * hedg::Timing::now_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_21;
  tm *local_20;
  tm *gmtm;
  time_t now;
  
  gmtm = (tm *)time((time_t *)0x0);
  local_20 = gmtime((time_t *)&gmtm);
  strftime(buf,0x15,"%FT%TZ",local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,buf,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return in_RDI;
}

Assistant:

std::string Timing::now() {
	std::time_t now = std::time(0);
	tm* gmtm = gmtime(&now);
	std::strftime(buf, time_size, "%FT%TZ", gmtm);
	return buf;
}